

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

ForStreamable<MoveOnly,_std::string> *
lest::make_string<MoveOnly>
          (ForStreamable<MoveOnly,_std::string> *__return_storage_ptr__,MoveOnly *item)

{
  ostringstream local_190 [8];
  ostringstream os;
  MoveOnly *item_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  ::operator<<((ostream *)local_190,item);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

auto make_string( T const & item ) -> ForStreamable<T, std::string>
{
    std::ostringstream os; os << item; return os.str();
}